

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

void __thiscall Js::RecyclableObject::RecyclableObject(RecyclableObject *this,Type *type)

{
  bool bVar1;
  JITManager *this_00;
  ScriptContext *scriptContext;
  Type *type_local;
  RecyclableObject *this_local;
  
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e49508;
  Memory::WriteBarrierPtr<Js::Type>::WriteBarrierPtr(&this->type,type);
  this_00 = JITManager::GetJITManager();
  bVar1 = JITManager::IsOOPJITEnabled(this_00);
  if (!bVar1) {
    scriptContext = Js::Type::GetScriptContext(type);
    RecordAllocation(this,scriptContext);
  }
  return;
}

Assistant:

RecyclableObject::RecyclableObject(Type * type) : type(type)
    {
#if DBG_EXTRAFIELD
        dtorCalled = false;
#ifdef HEAP_ENUMERATION_VALIDATION
        m_heapEnumValidationCookie = 0;
#endif
#endif
#if DBG || defined(PROFILE_TYPES)
#if ENABLE_NATIVE_CODEGEN
        if (!JITManager::GetJITManager()->IsOOPJITEnabled())
#endif
        {
            RecordAllocation(type->GetScriptContext());
        }
#endif
    }